

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O2

void saturate_threadpool(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  uv_work_t *puVar5;
  undefined8 uStack_80;
  char buf [64];
  
  snprintf(buf,0x40,"UV_THREADPOOL_SIZE=%lu",4);
  putenv(buf);
  uVar2 = uv_default_loop();
  lVar3 = 0;
  puVar5 = pause_reqs;
  while( true ) {
    if (lVar3 + 0x20 == 0xa0) {
      return;
    }
    iVar1 = uv_sem_init((long)pause_sems + lVar3,0);
    if (iVar1 != 0) break;
    iVar1 = uv_queue_work(uVar2,puVar5,work_cb,done_cb);
    lVar3 = lVar3 + 0x20;
    puVar5 = puVar5 + 1;
    if (iVar1 != 0) {
      pcVar4 = "0 == uv_queue_work(loop, pause_reqs + i, work_cb, done_cb)";
      uStack_80 = 0x4d;
LAB_0015d5f2:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,uStack_80,pcVar4);
      abort();
    }
  }
  pcVar4 = "0 == uv_sem_init(pause_sems + i, 0)";
  uStack_80 = 0x4c;
  goto LAB_0015d5f2;
}

Assistant:

static void saturate_threadpool(void) {
  uv_loop_t* loop;
  char buf[64];
  size_t i;

  snprintf(buf,
           sizeof(buf),
           "UV_THREADPOOL_SIZE=%lu",
           (unsigned long)ARRAY_SIZE(pause_reqs));
  putenv(buf);

  loop = uv_default_loop();
  for (i = 0; i < ARRAY_SIZE(pause_reqs); i += 1) {
    ASSERT(0 == uv_sem_init(pause_sems + i, 0));
    ASSERT(0 == uv_queue_work(loop, pause_reqs + i, work_cb, done_cb));
  }
}